

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glu.cpp
# Opt level: O2

int __thiscall ncnn::GLU::forward(GLU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int i;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  int x;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  void *pvVar14;
  int i_1;
  ulong uVar15;
  void *pvVar16;
  int y;
  uint uVar17;
  int iVar18;
  void *pvVar19;
  float fVar20;
  int local_78;
  
  uVar11 = bottom_blob->dims;
  if (uVar11 == 1) {
    uVar15 = (long)bottom_blob->w / 2;
    iVar7 = (int)uVar15;
    Mat::create(top_blob,iVar7,4,opt->blob_allocator);
    pvVar16 = bottom_blob->data;
    pvVar9 = top_blob->data;
    local_78 = 0;
    uVar8 = 0;
    if (0 < iVar7) {
      uVar8 = uVar15 & 0xffffffff;
    }
    for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
      fVar20 = expf(-*(float *)((long)pvVar16 + uVar15 * 4 + (long)iVar7 * 4));
      *(float *)((long)pvVar9 + uVar15 * 4) =
           *(float *)((long)pvVar16 + uVar15 * 4) / (fVar20 + 1.0);
    }
  }
  else {
    iVar7 = (this->axis >> 0x1f & uVar11) + this->axis;
    if ((uVar11 == 2) && (iVar7 == 0)) {
      iVar7 = bottom_blob->w;
      iVar5 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar7,iVar5,4,opt->blob_allocator);
      uVar11 = iVar5 * iVar7;
      pvVar16 = bottom_blob->data;
      pvVar9 = top_blob->data;
      local_78 = 0;
      uVar15 = 0;
      if (0 < (int)uVar11) {
        uVar15 = (ulong)uVar11;
      }
      for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
        fVar20 = expf(-*(float *)((long)pvVar16 + uVar8 * 4 + (long)(int)uVar11 * 4));
        *(float *)((long)pvVar9 + uVar8 * 4) =
             *(float *)((long)pvVar16 + uVar8 * 4) / (fVar20 + 1.0);
      }
    }
    else if ((uVar11 == 2) && (iVar7 == 1)) {
      uVar11 = bottom_blob->h;
      uVar15 = (long)bottom_blob->w / 2;
      iVar7 = (int)uVar15;
      Mat::create(top_blob,iVar7,uVar11,4,opt->blob_allocator);
      pvVar16 = bottom_blob->data;
      pvVar9 = top_blob->data;
      uVar8 = 0;
      if (0 < iVar7) {
        uVar8 = uVar15 & 0xffffffff;
      }
      iVar5 = top_blob->w;
      local_78 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      lVar13 = (long)bottom_blob->w * bottom_blob->elemsize;
      sVar1 = top_blob->elemsize;
      pvVar14 = (void *)((long)iVar7 * 4 + (long)pvVar16);
      for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          fVar20 = expf(-*(float *)((long)pvVar14 + uVar12 * 4));
          *(float *)((long)pvVar9 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) / (fVar20 + 1.0);
        }
        pvVar14 = (void *)((long)pvVar14 + lVar13);
        pvVar9 = (void *)((long)pvVar9 + (long)iVar5 * sVar1);
        pvVar16 = (void *)((long)pvVar16 + lVar13);
      }
    }
    else if ((uVar11 == 3) && (iVar7 == 0)) {
      iVar7 = bottom_blob->w;
      iVar5 = bottom_blob->h;
      uVar15 = (long)bottom_blob->c / 2;
      iVar6 = (int)uVar15;
      Mat::create(top_blob,iVar7,iVar5,iVar6,4,opt->blob_allocator);
      pvVar16 = bottom_blob->data;
      uVar11 = iVar5 * iVar7;
      pvVar9 = top_blob->data;
      sVar1 = top_blob->cstep;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      local_78 = 0;
      uVar15 = uVar15 & 0xffffffff;
      if (iVar6 < 1) {
        uVar15 = 0;
      }
      lVar13 = bottom_blob->cstep * bottom_blob->elemsize;
      sVar2 = top_blob->elemsize;
      pvVar14 = (void *)((long)((int)bottom_blob->cstep * iVar6) * 4 + (long)pvVar16);
      for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          fVar20 = expf(-*(float *)((long)pvVar14 + uVar12 * 4));
          *(float *)((long)pvVar9 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) / (fVar20 + 1.0);
        }
        pvVar14 = (void *)((long)pvVar14 + lVar13);
        pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
        pvVar16 = (void *)((long)pvVar16 + lVar13);
      }
    }
    else if ((uVar11 == 3) && (iVar7 == 1)) {
      iVar7 = bottom_blob->w;
      uVar11 = bottom_blob->c;
      iVar5 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar7,iVar5,uVar11,4,opt->blob_allocator);
      uVar17 = iVar5 * iVar7;
      pvVar16 = bottom_blob->data;
      pvVar9 = top_blob->data;
      uVar15 = 0;
      if (0 < (int)uVar17) {
        uVar15 = (ulong)uVar17;
      }
      sVar1 = top_blob->cstep;
      local_78 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      lVar13 = bottom_blob->cstep * bottom_blob->elemsize;
      sVar2 = top_blob->elemsize;
      pvVar14 = (void *)((long)pvVar16 + (long)(int)uVar17 * 4);
      for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
        for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
          fVar20 = expf(-*(float *)((long)pvVar14 + uVar12 * 4));
          *(float *)((long)pvVar9 + uVar12 * 4) =
               *(float *)((long)pvVar16 + uVar12 * 4) / (fVar20 + 1.0);
        }
        pvVar14 = (void *)((long)pvVar14 + lVar13);
        pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
        pvVar16 = (void *)((long)pvVar16 + lVar13);
      }
    }
    else {
      local_78 = -100;
      if ((uVar11 == 3) && (iVar7 == 2)) {
        iVar7 = bottom_blob->w;
        iVar5 = bottom_blob->h;
        uVar11 = bottom_blob->c;
        uVar15 = (long)iVar7 / 2;
        iVar6 = (int)uVar15;
        Mat::create(top_blob,iVar6,iVar5,uVar11,4,opt->blob_allocator);
        pvVar16 = bottom_blob->data;
        sVar1 = bottom_blob->cstep;
        sVar2 = top_blob->cstep;
        uVar8 = 0;
        if (0 < iVar6) {
          uVar8 = uVar15 & 0xffffffff;
        }
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        local_78 = 0;
        uVar15 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar15 = 0;
        }
        sVar3 = top_blob->elemsize;
        pvVar9 = top_blob->data;
        sVar4 = bottom_blob->elemsize;
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          pvVar14 = pvVar9;
          pvVar19 = pvVar16;
          for (iVar18 = 0; iVar18 != iVar5; iVar18 = iVar18 + 1) {
            for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
              fVar20 = expf(-*(float *)((long)pvVar19 + uVar10 * 4 + (long)iVar6 * 4));
              *(float *)((long)pvVar14 + uVar10 * 4) =
                   *(float *)((long)pvVar19 + uVar10 * 4) / (fVar20 + 1.0);
            }
            pvVar14 = (void *)((long)pvVar14 + (long)iVar6 * 4);
            pvVar19 = (void *)((long)pvVar19 + (long)iVar7 * 4);
          }
          pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
          pvVar16 = (void *)((long)pvVar16 + sVar1 * sVar4);
        }
      }
    }
  }
  return local_78;
}

Assistant:

int GLU::forward(const Mat& bottom_blob, Mat& top_blob,
                 const Option& opt) const
{
    int dims = bottom_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_blob.w;
        int out_w = w / 2;
        top_blob.create(out_w, sizeof(float), opt.blob_allocator);

        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int x = 0; x < out_w; ++x)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));

            out_ptr[x] = in_ptr[x] * sigmoid;
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w;
        int out_h = h / 2;
        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        int offset = out_w * out_h;

#if 0
        // this one is equivalent to the else branch. It is more readable
        // but less efficient
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < out_h; ++y) {
            const float *in_ptr = bottom_blob.row(y);
            float *out_ptr = top_blob.row(y);

            for (int x = 0; x < w; ++x) {
                float sigmoid =
                    1.f / (1.f + expf(-in_ptr[x + offset]));

                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }
#else
        int size = offset;
        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; ++i)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
            out_ptr[i] = in_ptr[i] * sigmoid;
        }
#endif

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w / 2;
        int out_h = h;

        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; ++y)
        {
            const float* in_ptr = bottom_blob.row(y);
            float* out_ptr = top_blob.row(y);

            for (int x = 0; x < out_w; ++x)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h;
        int out_c = c / 2;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_c * bottom_blob.cstep;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < out_c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } //   if (dims == 3 && positive_axis == 0) {

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h / 2;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_h * out_w;
        int size = offset;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w / 2;
        int out_h = h;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < out_w; ++x)
                {
                    float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                    out_ptr[x] = in_ptr[x] * sigmoid;
                }
                in_ptr += w;
                out_ptr += out_w;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}